

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O0

double Js::Math::HypotHelper(Arguments *args,ScriptContext *scriptContext)

{
  bool bVar1;
  bool bVar2;
  BOOL BVar3;
  Var aValue;
  double dVar4;
  double doubleVal;
  double dStack_38;
  uint counter;
  double sum;
  double scale;
  bool foundNaN;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  
  bVar1 = false;
  sum = 0.0;
  dStack_38 = 0.0;
  doubleVal._4_4_ = 1;
  while( true ) {
    if ((SUB84(args->Info,0) & 0xffffff) <= doubleVal._4_4_) {
      if (bVar1) {
        args_local = (Arguments *)NumberConstants::NaN;
      }
      else {
        dVar4 = sqrt(dStack_38);
        args_local = (Arguments *)(sum * dVar4);
      }
      return (double)args_local;
    }
    aValue = Arguments::operator[](args,doubleVal._4_4_);
    dVar4 = JavascriptConversion::ToNumber(aValue,scriptContext);
    bVar2 = JavascriptNumber::IsPosInf(dVar4);
    if ((bVar2) || (bVar2 = JavascriptNumber::IsNegInf(dVar4), bVar2)) break;
    if (!bVar1) {
      BVar3 = JavascriptNumber::IsNan(dVar4);
      if (BVar3 == 0) {
        dVar4 = Abs(dVar4);
        if (dVar4 <= sum) {
          if ((sum != 0.0) || (NAN(sum))) {
            dStack_38 = (dVar4 / sum) * (dVar4 / sum) + dStack_38;
          }
        }
        else {
          dStack_38 = dStack_38 * (sum / dVar4) * (sum / dVar4) + 1.0;
          sum = dVar4;
        }
      }
      else {
        bVar1 = true;
      }
    }
    doubleVal._4_4_ = doubleVal._4_4_ + 1;
  }
  return NumberConstants::POSITIVE_INFINITY;
}

Assistant:

double Math::HypotHelper(Arguments args, ScriptContext *scriptContext)
    {
        // CRT does not have a multiple version of hypot, so we implement it here ourselves.
        bool foundNaN = false;
        double scale = 0;
        double sum = 0;

        //Ignore first argument which is this pointer
        for (uint counter = 1; counter < args.Info.Count; counter++)
        {
            double doubleVal = JavascriptConversion::ToNumber(args[counter], scriptContext);

            if (JavascriptNumber::IsPosInf(doubleVal) || JavascriptNumber::IsNegInf(doubleVal))
            {
                return JavascriptNumber::POSITIVE_INFINITY;
            }

            if (!foundNaN)
            {
                if (JavascriptNumber::IsNan(doubleVal))
                {
                    //Even though we found NaN, we still need to validate none of the other arguments are +Infinity or -Infinity
                    foundNaN = true;
                }
                else
                {
                    doubleVal = Math::Abs(doubleVal);
                    if (scale < doubleVal)
                    {
                        sum = sum * (scale / doubleVal) * (scale / doubleVal) + 1; /* scale/scale === 1*/
                        //change the scale to new max value
                        scale = doubleVal;
                    }
                    else if (scale != 0)
                    {
                        sum += (doubleVal / scale) * (doubleVal / scale);
                    }
                }
            }
        }

        if (foundNaN)
        {
            return JavascriptNumber::NaN;
        }

        return scale * ::sqrt(sum);
    }